

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_edge_query_base.h
# Opt level: O0

void __thiscall
S2ClosestEdgeQueryBase<S2MinDistance>::FindClosestEdgesOptimized
          (S2ClosestEdgeQueryBase<S2MinDistance> *this)

{
  uint64 uVar1;
  S2ShapeIndexCell *pSVar2;
  bool bVar3;
  const_reference pQVar4;
  S2CellId id_00;
  bool local_2a9;
  bool local_29a;
  bool local_299;
  bool local_289;
  S2CellId local_26c;
  uint64 local_264;
  S2CellId local_25c;
  uint64 local_254;
  uint64 local_24c;
  S2CellId local_244;
  S2CellId local_23c;
  uint64 local_234;
  uint64 local_22c;
  uint64 local_224;
  S2CellId local_21c;
  uint64 local_214;
  S2CellId local_20c;
  uint64 local_204;
  S2CellId local_1fc;
  S2CellId local_1f4;
  uint64 local_1ec;
  S2CellId local_1e4;
  S2CellId id;
  priority_queue<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,_absl::InlinedVector<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>_>,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>_>
  local_1d0;
  double local_40;
  S1ChordAngle local_38;
  S1ChordAngle local_30;
  S2MinDistance distance;
  QueueEntry entry;
  S2ClosestEdgeQueryBase<S2MinDistance> *this_local;
  
  InitQueue(this);
  while( true ) {
    bVar3 = std::
            priority_queue<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,_absl::InlinedVector<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>_>,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>_>
            ::empty(&this->queue_);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      return;
    }
    pQVar4 = std::
             priority_queue<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,_absl::InlinedVector<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>_>,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>_>
             ::top(&this->queue_);
    distance.super_S1ChordAngle.length2_ =
         (S1ChordAngle)(pQVar4->distance).super_S1ChordAngle.length2_;
    uVar1 = (pQVar4->id).id_;
    pSVar2 = pQVar4->index_cell;
    std::
    priority_queue<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,_absl::InlinedVector<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>_>,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>_>
    ::pop(&this->queue_);
    local_30 = distance.super_S1ChordAngle.length2_;
    local_38 = distance.super_S1ChordAngle.length2_;
    local_40 = (this->distance_limit_).super_S1ChordAngle.length2_;
    bVar3 = ::operator<(distance.super_S1ChordAngle.length2_,(S1ChordAngle)local_40);
    if (!bVar3) break;
    if (pSVar2 == (S2ShapeIndexCell *)0x0) {
      local_1e4.id_ = uVar1;
      local_1f4 = S2CellId::child(&local_1e4,1);
      local_1ec = (uint64)S2CellId::range_min(&local_1f4);
      S2ShapeIndex::Iterator::Seek(&this->iter_,(S2CellId)local_1ec);
      bVar3 = S2ShapeIndex::Iterator::done(&this->iter_);
      local_289 = false;
      if (!bVar3) {
        local_1fc = S2ShapeIndex::Iterator::id(&this->iter_);
        local_20c = S2CellId::child(&local_1e4,1);
        local_204 = (uint64)S2CellId::range_max(&local_20c);
        local_289 = operator<=(local_1fc,(S2CellId)local_204);
      }
      if (local_289 != false) {
        local_214 = (uint64)S2CellId::child(&local_1e4,1);
        ProcessOrEnqueue(this,(S2CellId)local_214);
      }
      bVar3 = S2ShapeIndex::Iterator::Prev(&this->iter_);
      local_299 = false;
      if (bVar3) {
        local_21c = S2ShapeIndex::Iterator::id(&this->iter_);
        local_224 = (uint64)S2CellId::range_min(&local_1e4);
        local_299 = operator>=(local_21c,(S2CellId)local_224);
      }
      if (local_299 != false) {
        local_22c = (uint64)S2CellId::child(&local_1e4,0);
        ProcessOrEnqueue(this,(S2CellId)local_22c);
      }
      local_23c = S2CellId::child(&local_1e4,3);
      local_234 = (uint64)S2CellId::range_min(&local_23c);
      S2ShapeIndex::Iterator::Seek(&this->iter_,(S2CellId)local_234);
      bVar3 = S2ShapeIndex::Iterator::done(&this->iter_);
      local_29a = false;
      if (!bVar3) {
        local_244 = S2ShapeIndex::Iterator::id(&this->iter_);
        local_24c = (uint64)S2CellId::range_max(&local_1e4);
        local_29a = operator<=(local_244,(S2CellId)local_24c);
      }
      if (local_29a != false) {
        local_254 = (uint64)S2CellId::child(&local_1e4,3);
        ProcessOrEnqueue(this,(S2CellId)local_254);
      }
      bVar3 = S2ShapeIndex::Iterator::Prev(&this->iter_);
      local_2a9 = false;
      if (bVar3) {
        local_25c = S2ShapeIndex::Iterator::id(&this->iter_);
        local_26c = S2CellId::child(&local_1e4,2);
        local_264 = (uint64)S2CellId::range_min(&local_26c);
        local_2a9 = operator>=(local_25c,(S2CellId)local_264);
      }
      if (local_2a9 != false) {
        id_00 = S2CellId::child(&local_1e4,2);
        ProcessOrEnqueue(this,id_00);
      }
    }
    else {
      ProcessEdges(this,(QueueEntry *)&distance);
    }
  }
  std::
  priority_queue<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,absl::InlinedVector<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,16ul,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>>,std::less<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>>
  ::
  priority_queue<absl::InlinedVector<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,16ul,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>>,void>
            ((priority_queue<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,absl::InlinedVector<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,16ul,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>>,std::less<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>>
              *)&local_1d0);
  std::
  priority_queue<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,_absl::InlinedVector<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>_>,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>_>
  ::operator=(&this->queue_,&local_1d0);
  std::
  priority_queue<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,_absl::InlinedVector<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>_>,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>_>
  ::~priority_queue(&local_1d0);
  return;
}

Assistant:

void S2ClosestEdgeQueryBase<Distance>::FindClosestEdgesOptimized() {
  InitQueue();
  // Repeatedly find the closest S2Cell to "target" and either split it into
  // its four children or process all of its edges.
  while (!queue_.empty()) {
    // We need to copy the top entry before removing it, and we need to
    // remove it before adding any new entries to the queue.
    QueueEntry entry = queue_.top();
    queue_.pop();
    // Work around weird parse error in gcc 4.9 by using a local variable for
    // entry.distance.
    Distance distance = entry.distance;
    if (!(distance < distance_limit_)) {
      queue_ = CellQueue();  // Clear any remaining entries.
      break;
    }
    // If this is already known to be an index cell, just process it.
    if (entry.index_cell != nullptr) {
      ProcessEdges(entry);
      continue;
    }
    // Otherwise split the cell into its four children.  Before adding a
    // child back to the queue, we first check whether it is empty.  We do
    // this in two seek operations rather than four by seeking to the key
    // between children 0 and 1 and to the key between children 2 and 3.
    S2CellId id = entry.id;
    iter_.Seek(id.child(1).range_min());
    if (!iter_.done() && iter_.id() <= id.child(1).range_max()) {
      ProcessOrEnqueue(id.child(1));
    }
    if (iter_.Prev() && iter_.id() >= id.range_min()) {
      ProcessOrEnqueue(id.child(0));
    }
    iter_.Seek(id.child(3).range_min());
    if (!iter_.done() && iter_.id() <= id.range_max()) {
      ProcessOrEnqueue(id.child(3));
    }
    if (iter_.Prev() && iter_.id() >= id.child(2).range_min()) {
      ProcessOrEnqueue(id.child(2));
    }
  }
}